

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vectors.h
# Opt level: O2

TVector2<double> __thiscall TAngle<double>::ToVector(TAngle<double> *this,double length)

{
  TAngle<double> *in_RSI;
  double dVar1;
  double dVar2;
  TVector2<double> TVar3;
  
  dVar1 = Cos(in_RSI);
  dVar2 = Sin(in_RSI);
  TVar3.X = length * dVar1;
  this->Degrees = TVar3.X;
  this[1].Degrees = length * dVar2;
  TVar3.Y = dVar1;
  return TVar3;
}

Assistant:

TVector2<vec_t> ToVector(vec_t length = 1) const
	{
		return TVector2<vec_t>(length * Cos(), length * Sin());
	}